

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O3

void __thiscall
slang::parsing::anon_unknown_4::MetadataVisitor::handle
          (MetadataVisitor *this,ModuleDeclarationSyntax *syntax)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  bool bVar4;
  undefined4 uVar5;
  value_type_pointer ppVar6;
  pointer puVar7;
  size_type sVar8;
  value_type_pointer pbVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  byte bVar12;
  size_t __n;
  int iVar13;
  size_t sVar14;
  SyntaxNode *pSVar15;
  size_t sVar16;
  ulong uVar17;
  uint uVar18;
  size_type __rlen;
  ulong uVar19;
  ulong uVar20;
  ulong hash;
  long lVar21;
  ulong uVar22;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_00;
  uchar uVar23;
  uchar uVar25;
  uchar uVar26;
  byte bVar27;
  undefined1 auVar24 [16];
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  byte bVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  undefined1 auVar28 [16];
  byte bVar40;
  Token token;
  size_t pos;
  string_view name;
  locator res;
  try_emplace_args_t local_e1;
  _Storage<slang::TimeScale,_true> local_e0;
  bool local_dc;
  pointer local_d8;
  uint64_t local_d0;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_c8;
  ulong local_c0;
  string_view local_b8;
  char *local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  ulong local_90;
  group_type_pointer local_88;
  locator local_80;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  pSVar15 = (syntax->super_MemberSyntax).super_SyntaxNode.parent;
  if ((pSVar15 != (SyntaxNode *)0x0) && (pSVar15->kind != CompilationUnit)) {
    local_b8 = Token::valueText(&((syntax->header).ptr)->name);
    puVar7 = (this->moduleDeclStack).
             super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             .data_;
    sVar8 = (this->moduleDeclStack).
            super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            .len;
    local_d8 = puVar7 + sVar8;
    this_00 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              (puVar7 + (sVar8 - 1));
    local_d0 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         (this_00,&local_b8);
    uVar19 = local_d0 >> ((byte)*this_00 & 0x3f);
    local_88 = puVar7[sVar8 - 1].table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.groups_;
    lVar21 = (local_d0 & 0xff) * 4;
    uVar23 = (&UNK_004a938c)[lVar21];
    uVar25 = (&UNK_004a938d)[lVar21];
    uVar26 = (&UNK_004a938e)[lVar21];
    bVar27 = (&UNK_004a938f)[lVar21];
    __n = local_b8._M_len;
    local_a8 = local_b8._M_str;
    local_90 = (ulong)((uint)local_d0 & 7);
    uVar22 = 0;
    uVar29 = uVar23;
    uVar30 = uVar25;
    uVar31 = uVar26;
    bVar32 = bVar27;
    uVar33 = uVar23;
    uVar34 = uVar25;
    uVar35 = uVar26;
    bVar36 = bVar27;
    uVar37 = uVar23;
    uVar38 = uVar25;
    uVar39 = uVar26;
    bVar40 = bVar27;
    local_c8 = this_00;
    local_98 = uVar19;
    do {
      pgVar3 = local_88 + uVar19;
      local_48 = pgVar3->m[0].n;
      uStack_47 = pgVar3->m[1].n;
      uStack_46 = pgVar3->m[2].n;
      bStack_45 = pgVar3->m[3].n;
      uStack_44 = pgVar3->m[4].n;
      uStack_43 = pgVar3->m[5].n;
      uStack_42 = pgVar3->m[6].n;
      bStack_41 = pgVar3->m[7].n;
      uStack_40 = pgVar3->m[8].n;
      uStack_3f = pgVar3->m[9].n;
      uStack_3e = pgVar3->m[10].n;
      bStack_3d = pgVar3->m[0xb].n;
      uStack_3c = pgVar3->m[0xc].n;
      uStack_3b = pgVar3->m[0xd].n;
      uStack_3a = pgVar3->m[0xe].n;
      bVar12 = pgVar3->m[0xf].n;
      auVar24[0] = -(local_48 == uVar23);
      auVar24[1] = -(uStack_47 == uVar25);
      auVar24[2] = -(uStack_46 == uVar26);
      auVar24[3] = -(bStack_45 == bVar27);
      auVar24[4] = -(uStack_44 == uVar29);
      auVar24[5] = -(uStack_43 == uVar30);
      auVar24[6] = -(uStack_42 == uVar31);
      auVar24[7] = -(bStack_41 == bVar32);
      auVar24[8] = -(uStack_40 == uVar33);
      auVar24[9] = -(uStack_3f == uVar34);
      auVar24[10] = -(uStack_3e == uVar35);
      auVar24[0xb] = -(bStack_3d == bVar36);
      auVar24[0xc] = -(uStack_3c == uVar37);
      auVar24[0xd] = -(uStack_3b == uVar38);
      auVar24[0xe] = -(uStack_3a == uVar39);
      auVar24[0xf] = -(bVar12 == bVar40);
      uVar18 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe);
      local_c0 = uVar19;
      bStack_39 = bVar12;
      if (uVar18 != 0) {
        pbVar9 = local_d8[-1].table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                 .arrays.elements_;
        local_68 = uVar23;
        uStack_67 = uVar25;
        uStack_66 = uVar26;
        bStack_65 = bVar27;
        uStack_64 = uVar29;
        uStack_63 = uVar30;
        uStack_62 = uVar31;
        bStack_61 = bVar32;
        uStack_60 = uVar33;
        uStack_5f = uVar34;
        uStack_5e = uVar35;
        bStack_5d = bVar36;
        uStack_5c = uVar37;
        uStack_5b = uVar38;
        uStack_5a = uVar39;
        bStack_59 = bVar40;
        do {
          iVar13 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> iVar13 & 1) == 0; iVar13 = iVar13 + 1) {
            }
          }
          if ((__n == *(size_t *)((long)&pbVar9[uVar19 * 0xf]._M_len + (ulong)(uint)(iVar13 << 4)))
             && ((__n == 0 ||
                 (iVar13 = bcmp(local_a8,*(void **)((long)&pbVar9[uVar19 * 0xf]._M_str +
                                                   (ulong)(uint)(iVar13 << 4)),__n),
                 uVar23 = local_68, uVar25 = uStack_67, uVar26 = uStack_66, bVar27 = bStack_65,
                 uVar29 = uStack_64, uVar30 = uStack_63, uVar31 = uStack_62, bVar32 = bStack_61,
                 uVar33 = uStack_60, uVar34 = uStack_5f, uVar35 = uStack_5e, bVar36 = bStack_5d,
                 uVar37 = uStack_5c, uVar38 = uStack_5b, uVar39 = uStack_5a, bVar40 = bStack_59,
                 iVar13 == 0)))) goto LAB_003bf369;
          uVar18 = uVar18 - 1 & uVar18;
        } while (uVar18 != 0);
      }
      puVar7 = local_d8;
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[local_90] & bVar12) == 0) break;
      uVar17 = local_d8[-1].table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.groups_size_mask;
      lVar21 = local_c0 + uVar22;
      uVar22 = uVar22 + 1;
      uVar19 = lVar21 + 1U & uVar17;
    } while (uVar22 <= uVar17);
    if (local_d8[-1].table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.size <
        local_d8[-1].table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                ((locator *)&local_80,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)local_c8,(arrays_type *)local_c8,local_98,local_d0,&local_b8);
      psVar1 = &puVar7[-1].table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                ((locator *)&local_80,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)local_c8,local_d0,&local_b8);
    }
  }
LAB_003bf369:
  SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::emplace_back<>(&(this->moduleDeclStack).
                    super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  );
  sVar14 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
  if (sVar14 != 0) {
    uVar18 = 1;
    sVar14 = 0;
    do {
      pSVar15 = slang::syntax::SyntaxNode::childNode((SyntaxNode *)syntax,sVar14);
      if (pSVar15 == (SyntaxNode *)0x0) {
        token = slang::syntax::SyntaxNode::childToken((SyntaxNode *)syntax,sVar14);
        if (token.info != (Info *)0x0) {
          visitToken(this,token);
        }
      }
      else {
        slang::syntax::detail::
        visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::parsing::(anonymous_namespace)::MetadataVisitor>
                  (pSVar15,this);
      }
      sVar14 = (size_t)uVar18;
      sVar16 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
      uVar18 = uVar18 + 1;
    } while (sVar14 < sVar16);
  }
  SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::pop_back(&(this->moduleDeclStack).
              super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            );
  local_a8 = *(char **)&this->defaultNetType;
  bVar4 = this->cellDefine;
  local_dc = (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
             super__Optional_payload_base<slang::TimeScale>._M_engaged;
  local_e0 = (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
             super__Optional_payload_base<slang::TimeScale>._M_payload;
  local_b8._M_len = (size_t)syntax;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = syntax;
  hash = SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar17 = hash >> ((byte)(this->meta).nodeMap.table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                          .arrays.groups_size_index & 0x3f);
  uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar6 = (this->meta).nodeMap.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
           .arrays.elements_;
  uVar19 = (this->meta).nodeMap.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
           .arrays.groups_size_mask;
  uVar20 = 0;
  uVar22 = uVar17;
  do {
    pgVar2 = (this->meta).nodeMap.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
             .arrays.groups_ + uVar22;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    bStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    bStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    bStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    bStack_49 = pgVar2->m[0xf].n;
    uVar23 = (uchar)uVar5;
    auVar28[0] = -(local_58 == uVar23);
    uVar25 = (uchar)((uint)uVar5 >> 8);
    auVar28[1] = -(uStack_57 == uVar25);
    uVar26 = (uchar)((uint)uVar5 >> 0x10);
    auVar28[2] = -(uStack_56 == uVar26);
    bVar27 = (byte)((uint)uVar5 >> 0x18);
    auVar28[3] = -(bStack_55 == bVar27);
    auVar28[4] = -(uStack_54 == uVar23);
    auVar28[5] = -(uStack_53 == uVar25);
    auVar28[6] = -(uStack_52 == uVar26);
    auVar28[7] = -(bStack_51 == bVar27);
    auVar28[8] = -(uStack_50 == uVar23);
    auVar28[9] = -(uStack_4f == uVar25);
    auVar28[10] = -(uStack_4e == uVar26);
    auVar28[0xb] = -(bStack_4d == bVar27);
    auVar28[0xc] = -(uStack_4c == uVar23);
    auVar28[0xd] = -(uStack_4b == uVar25);
    auVar28[0xe] = -(uStack_4a == uVar26);
    auVar28[0xf] = -(bStack_49 == bVar27);
    for (uVar18 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe); uVar18 != 0;
        uVar18 = uVar18 - 1 & uVar18) {
      uVar10 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      if ((ModuleDeclarationSyntax *)ppVar6[uVar22 * 0xf + (ulong)uVar10].first == syntax) {
        local_80.p = ppVar6 + uVar22 * 0xf + (ulong)uVar10;
        goto LAB_003bf51b;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bStack_49) == 0) break;
    lVar21 = uVar22 + uVar20;
    uVar20 = uVar20 + 1;
    uVar22 = lVar21 + 1U & uVar19;
  } while (uVar20 <= uVar19);
  uStack_a0 = 0;
  if ((this->meta).nodeMap.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
      .size_ctrl.size <
      (this->meta).nodeMap.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              (&local_80,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
                *)this,(arrays_type *)this,uVar17,hash,&local_e1,(SyntaxNode **)&local_b8);
    psVar1 = &(this->meta).nodeMap.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              (&local_80,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
                *)this,hash,&local_e1,(SyntaxNode **)&local_b8);
  }
LAB_003bf51b:
  ((local_80.p)->second).defaultNetType = (short)local_a8._0_4_;
  ((local_80.p)->second).unconnectedDrive = (short)((uint)local_a8._0_4_ >> 0x10);
  ((local_80.p)->second).cellDefine = bVar4;
  ((local_80.p)->second).timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_payload = local_e0;
  ((local_80.p)->second).timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = local_dc;
  return;
}

Assistant:

void handle(const ModuleDeclarationSyntax& syntax) {
        if (syntax.parent && syntax.parent->kind != SyntaxKind::CompilationUnit) {
            auto name = syntax.header->name.valueText();
            moduleDeclStack.back().emplace(name);
        }

        moduleDeclStack.emplace_back();
        visitDefault(syntax);
        moduleDeclStack.pop_back();

        // Needs to come after we visitDefault because visiting the first token
        // might update our preproc state.
        meta.nodeMap[&syntax] = {defaultNetType, unconnectedDrive, cellDefine, timeScale};
    }